

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

bool __thiscall trento::MinDistNucleus::is_too_close(MinDistNucleus *this,const_iterator nucleon)

{
  bool bVar1;
  pointer pNVar2;
  long in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dz;
  double dy;
  double dx;
  const_iterator nucleon2;
  Nucleus *in_stack_ffffffffffffffa8;
  __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  local_20 [2];
  __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  local_10 [2];
  
  if (1e-10 <= *(double *)(in_RDI + 0x28)) {
    local_20[0]._M_current = (NucleonData *)Nucleus::begin(in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      pNVar2 = __gnu_cxx::
               __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
               ::operator->(local_10);
      in_stack_ffffffffffffffa8 = (Nucleus *)NucleonData::x(pNVar2);
      pNVar2 = __gnu_cxx::
               __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
               ::operator->(local_20);
      dVar3 = NucleonData::x(pNVar2);
      dVar3 = (double)in_stack_ffffffffffffffa8 - dVar3;
      pNVar2 = __gnu_cxx::
               __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
               ::operator->(local_10);
      in_stack_ffffffffffffffb0 =
           (__normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
            *)NucleonData::y(pNVar2);
      pNVar2 = __gnu_cxx::
               __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
               ::operator->(local_20);
      dVar4 = NucleonData::y(pNVar2);
      dVar4 = (double)in_stack_ffffffffffffffb0 - dVar4;
      pNVar2 = __gnu_cxx::
               __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
               ::operator->(local_10);
      dVar5 = NucleonData::z(pNVar2);
      pNVar2 = __gnu_cxx::
               __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
               ::operator->(local_20);
      dVar6 = NucleonData::z(pNVar2);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar3;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar3;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar4 * dVar4;
      auVar7 = vfmadd213sd_fma(auVar11,auVar7,auVar9);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar5 - dVar6;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar5 - dVar6;
      auVar7 = vfmadd213sd_fma(auVar10,auVar8,auVar7);
      if (auVar7._0_8_ < *(double *)(in_RDI + 0x28)) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
      ::operator++(local_20);
    }
  }
  return false;
}

Assistant:

bool MinDistNucleus::is_too_close(const_iterator nucleon) const {
  if (dminsq_ < 1e-10)
    return false;
  for (const_iterator nucleon2 = begin(); nucleon2 != nucleon; ++nucleon2) {
    auto dx = nucleon->x() - nucleon2->x();
    auto dy = nucleon->y() - nucleon2->y();
    auto dz = nucleon->z() - nucleon2->z();
    if (dx*dx + dy*dy + dz*dz < dminsq_)
      return true;
  }
  return false;
}